

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_pack16to8.h
# Opt level: O0

void ncnn::deconvolution_pack16to8_avx512
               (Mat *bottom_blob,Mat *top_blob,Mat *weight_data_packed,Mat *bias_data,int kernel_w,
               int kernel_h,int dilation_w,int dilation_h,int stride_w,int stride_h,
               int activation_type,Mat *activation_params,Option *opt)

{
  undefined4 *puVar1;
  undefined4 uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  long *plVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  long lVar109;
  long lVar110;
  long lVar111;
  long lVar112;
  int iVar113;
  int iVar114;
  undefined8 *puVar115;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  int in_stack_00000008;
  undefined4 in_stack_00000034;
  __m256 _wf;
  __m256 _we;
  __m256 _wd;
  __m256 _wc;
  __m256 _wb;
  __m256 _wa;
  __m256 _w9;
  __m256 _w8;
  __m256 _w7;
  __m256 _w6;
  __m256 _w5;
  __m256 _w4;
  __m256 _w3;
  __m256 _w2;
  __m256 _w1;
  __m256 _w0;
  __m256 _valf;
  __m256 _vale;
  __m256 _vald;
  __m256 _valc;
  __m256 _valb;
  __m256 _vala;
  __m256 _val9;
  __m256 _val8;
  __m256 _val7;
  __m256 _val6;
  __m256 _val5;
  __m256 _val4;
  __m256 _val3;
  __m256 _val2;
  __m256 _val1;
  __m256 _val0;
  int k;
  float *sptr;
  int sx;
  int sxs;
  int x;
  int sy;
  int sys;
  int y;
  Mat m_2;
  int q;
  float *kptr;
  __m256 _sum;
  int j;
  int i;
  int outh;
  int outw;
  int channels;
  int h;
  int w;
  int maxk;
  float *outptr;
  int p;
  float *bias_data_ptr;
  int kernel_extent_h;
  int kernel_extent_w;
  int outch;
  Mat *m;
  Mat *m_3;
  Mat *m_1;
  __m256 _b;
  __m256 _a;
  __m256 max;
  __m256 min;
  __m256 neg;
  __m256 pos;
  __m256 one;
  __m256 one_7;
  __m256 pow2n_1;
  __m256 y_2;
  __m256 mask_1;
  __m256 one_2;
  __m256i imm0_1;
  __m256 fx_1;
  __m256 tmp_1;
  __m256 pow2n;
  __m256 y_1;
  __m256 mask;
  __m256 one_1;
  __m256i imm0;
  __m256 fx;
  __m256 tmp;
  __m256 two;
  __m256 one_4;
  __m256 one_5;
  __m256 pow2n_2;
  __m256 y_4;
  __m256 mask_3;
  __m256 one_6;
  __m256i imm0_3;
  __m256 fx_2;
  __m256 tmp_3;
  __m256 y_3;
  __m256 z;
  __m256 tmp_2;
  __m256 mask_2;
  __m256 e;
  __m256 invalid_mask;
  __m256 one_3;
  __m256i imm0_2;
  undefined8 local_4a60;
  undefined8 uStack_4a58;
  int local_41b0;
  int local_41a4;
  int local_4154;
  long local_4108;
  undefined8 local_4100;
  undefined8 uStack_40f8;
  undefined8 uStack_40f0;
  undefined8 uStack_40e8;
  int local_40dc;
  int local_40d8;
  undefined1 (*local_4068) [32];
  int local_405c;
  undefined1 local_3200 [8];
  undefined8 uStack_31f8;
  undefined8 uStack_31f0;
  undefined8 uStack_31e8;
  float local_3000;
  float fStack_2ffc;
  float fStack_2ff8;
  float fStack_2ff4;
  float fStack_2ff0;
  float fStack_2fec;
  float fStack_2fe8;
  float fStack_2fe4;
  float local_2e80;
  float fStack_2e7c;
  float fStack_2e78;
  float fStack_2e74;
  float fStack_2e70;
  float fStack_2e6c;
  float fStack_2e68;
  float fStack_2e64;
  float local_2e20;
  float fStack_2e1c;
  float fStack_2e18;
  float fStack_2e14;
  float fStack_2e10;
  float fStack_2e0c;
  float fStack_2e08;
  float fStack_2e04;
  undefined1 local_2da0 [32];
  float local_2c60;
  float fStack_2c5c;
  float fStack_2c58;
  float fStack_2c54;
  float fStack_2c50;
  float fStack_2c4c;
  float fStack_2c48;
  undefined4 uStack_2c44;
  float local_2c40;
  float fStack_2c3c;
  float fStack_2c38;
  float fStack_2c34;
  float local_2c20;
  float fStack_2c1c;
  float fStack_2c18;
  float fStack_2c14;
  float fStack_2c10;
  float fStack_2c0c;
  float fStack_2c08;
  undefined4 uStack_2c04;
  float local_2c00;
  float fStack_2bfc;
  float fStack_2bf8;
  float fStack_2bf4;
  float fStack_2bf0;
  float fStack_2bec;
  float fStack_2be8;
  float local_2be0;
  float fStack_2bdc;
  float fStack_2bd8;
  float fStack_2bd4;
  float fStack_2bd0;
  float fStack_2bcc;
  float fStack_2bc8;
  float fStack_2bc4;
  undefined8 uStack_2bb0;
  undefined8 uStack_2ba8;
  undefined8 uStack_2b30;
  undefined8 uStack_2b28;
  undefined8 uStack_2af0;
  undefined8 uStack_2ae8;
  undefined8 uStack_2ab0;
  undefined8 uStack_2aa8;
  undefined8 uStack_2a70;
  undefined8 uStack_2a68;
  undefined8 uStack_2a30;
  undefined8 uStack_2a28;
  undefined1 local_2960 [32];
  undefined1 local_2900 [16];
  undefined8 uStack_28f0;
  undefined8 uStack_28e8;
  undefined1 local_28c0 [8];
  float fStack_28b8;
  float fStack_28b4;
  undefined1 local_28a0 [16];
  float local_2840;
  float fStack_283c;
  float fStack_2838;
  float fStack_2834;
  float local_27a0;
  float fStack_279c;
  float fStack_2798;
  float fStack_2794;
  float fStack_2790;
  float fStack_278c;
  float fStack_2788;
  float local_2740;
  float fStack_273c;
  float fStack_2738;
  float fStack_2734;
  undefined1 local_2700 [32];
  undefined1 local_26a0 [16];
  undefined8 uStack_2690;
  undefined8 uStack_2688;
  undefined1 local_2660 [8];
  float fStack_2658;
  float fStack_2654;
  float local_25e0;
  float fStack_25dc;
  float fStack_25d8;
  float fStack_25d4;
  float local_2540;
  float fStack_253c;
  float fStack_2538;
  float fStack_2534;
  float fStack_2530;
  float fStack_252c;
  float fStack_2528;
  float local_24e0;
  float fStack_24dc;
  float fStack_24d8;
  float fStack_24d4;
  float local_1ba0;
  float fStack_1b9c;
  float fStack_1b98;
  float fStack_1b94;
  float fStack_1b90;
  float fStack_1b8c;
  float fStack_1b88;
  float fStack_1b84;
  float local_1b80;
  float fStack_1b7c;
  float fStack_1b78;
  float fStack_1b74;
  float fStack_1b70;
  float fStack_1b6c;
  float fStack_1b68;
  float fStack_1b64;
  float local_1720;
  float fStack_171c;
  float fStack_1718;
  float fStack_1714;
  float fStack_1710;
  float fStack_170c;
  float fStack_1708;
  float fStack_1704;
  float local_1660;
  float fStack_165c;
  float fStack_1658;
  float fStack_1654;
  float fStack_1650;
  float fStack_164c;
  float fStack_1648;
  float local_1640;
  float fStack_163c;
  float fStack_1638;
  float fStack_1634;
  float fStack_1630;
  float fStack_162c;
  float fStack_1628;
  undefined4 uStack_1624;
  undefined8 uStack_15d0;
  undefined8 uStack_15c8;
  undefined8 uStack_1590;
  undefined8 uStack_1588;
  undefined1 local_1500 [32];
  undefined1 local_14a0 [16];
  undefined8 uStack_1490;
  undefined8 uStack_1488;
  undefined1 local_1460 [8];
  float fStack_1458;
  float fStack_1454;
  float local_13e0;
  float fStack_13dc;
  float fStack_13d8;
  float fStack_13d4;
  float local_1340;
  float fStack_133c;
  float fStack_1338;
  float fStack_1334;
  float fStack_1330;
  float fStack_132c;
  float fStack_1328;
  float local_12e0;
  float fStack_12dc;
  float fStack_12d8;
  float fStack_12d4;
  float local_e40;
  float fStack_e3c;
  float fStack_e38;
  float fStack_e34;
  float fStack_e30;
  float fStack_e2c;
  float fStack_e28;
  float fStack_e24;
  undefined1 local_c40 [8];
  float fStack_c38;
  float fStack_c34;
  float fStack_c30;
  float fStack_c2c;
  float fStack_c28;
  undefined4 uStack_c24;
  undefined1 local_bc0 [8];
  float fStack_bb8;
  float fStack_bb4;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined1 local_b40 [8];
  float fStack_b38;
  float fStack_b34;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  float local_b00;
  float fStack_afc;
  float fStack_af8;
  float fStack_af4;
  float local_ac0;
  float fStack_abc;
  float fStack_ab8;
  float fStack_ab4;
  float fStack_ab0;
  float fStack_aac;
  float fStack_aa8;
  float fStack_aa4;
  float local_aa0;
  float fStack_a9c;
  float fStack_a98;
  float fStack_a94;
  float fStack_a90;
  float fStack_a8c;
  float fStack_a88;
  float fStack_a84;
  float local_a60;
  float fStack_a5c;
  float fStack_a58;
  float fStack_a54;
  float fStack_a50;
  float fStack_a4c;
  float fStack_a48;
  float fStack_a44;
  float local_9a0;
  float fStack_99c;
  float fStack_998;
  float fStack_994;
  
  lVar109 = in_RSI[7];
  lVar6 = *in_RCX;
  for (local_405c = 0; local_405c < (int)lVar109; local_405c = local_405c + 1) {
    local_4068 = (undefined1 (*) [32])(*in_RSI + in_RSI[8] * (long)local_405c * in_RSI[2]);
    iVar4 = *(int *)((long)in_RDI + 0x2c);
    lVar110 = in_RDI[6];
    lVar111 = in_RDI[7];
    iVar5 = *(int *)((long)in_RSI + 0x2c);
    lVar112 = in_RSI[6];
    for (local_40d8 = 0; local_40d8 < (int)lVar112; local_40d8 = local_40d8 + 1) {
      for (local_40dc = 0; local_40dc < iVar5; local_40dc = local_40dc + 1) {
        local_4100 = 0;
        uStack_40f8 = 0;
        uStack_40f0 = 0;
        uStack_40e8 = 0;
        if (lVar6 != 0) {
          puVar115 = (undefined8 *)(lVar6 + (long)(local_405c << 3) * 4);
          local_4100 = *puVar115;
          uStack_40f8 = puVar115[1];
          uStack_40f0 = puVar115[2];
          uStack_40e8 = puVar115[3];
        }
        local_4108 = *in_RDX + in_RDX[8] * (long)local_405c * in_RDX[2];
        for (local_4154 = 0; local_4154 < (int)lVar111; local_4154 = local_4154 + 1) {
          for (local_41a4 = 0; local_41a4 < in_R9D; local_41a4 = local_41a4 + 1) {
            iVar113 = (local_40d8 + local_41a4 * dilation_w) - dilation_w * (in_R9D + -1);
            if (((-1 < iVar113) && (iVar113 % stride_w == 0)) && (iVar113 / stride_w < (int)lVar110)
               ) {
              for (local_41b0 = 0; local_41b0 < in_R8D; local_41b0 = local_41b0 + 1) {
                iVar114 = (local_40dc + local_41b0 * in_stack_00000008) -
                          in_stack_00000008 * (in_R8D + -1);
                if (((-1 < iVar114) && (iVar114 % dilation_h == 0)) &&
                   (iVar114 / dilation_h < iVar4)) {
                  puVar1 = (undefined4 *)
                           (*in_RDI + in_RDI[8] * (long)local_4154 * in_RDI[2] +
                            (long)*(int *)((long)in_RDI + 0x2c) * (long)(iVar113 / stride_w) *
                            in_RDI[2] + (long)(iVar114 / dilation_h << 4) * 4);
                  iVar114 = (local_41a4 * in_R8D + local_41b0) * 0x80;
                  uVar2 = *puVar1;
                  auVar28._4_4_ = uVar2;
                  auVar28._0_4_ = uVar2;
                  auVar28._12_4_ = uVar2;
                  auVar28._8_4_ = uVar2;
                  auVar28._20_4_ = uVar2;
                  auVar28._16_4_ = uVar2;
                  auVar28._28_4_ = uVar2;
                  auVar28._24_4_ = uVar2;
                  uVar2 = puVar1[1];
                  auVar26._4_4_ = uVar2;
                  auVar26._0_4_ = uVar2;
                  auVar26._12_4_ = uVar2;
                  auVar26._8_4_ = uVar2;
                  auVar26._20_4_ = uVar2;
                  auVar26._16_4_ = uVar2;
                  auVar26._28_4_ = uVar2;
                  auVar26._24_4_ = uVar2;
                  uVar2 = puVar1[2];
                  auVar25._4_4_ = uVar2;
                  auVar25._0_4_ = uVar2;
                  auVar25._12_4_ = uVar2;
                  auVar25._8_4_ = uVar2;
                  auVar25._20_4_ = uVar2;
                  auVar25._16_4_ = uVar2;
                  auVar25._28_4_ = uVar2;
                  auVar25._24_4_ = uVar2;
                  uVar2 = puVar1[3];
                  auVar24._4_4_ = uVar2;
                  auVar24._0_4_ = uVar2;
                  auVar24._12_4_ = uVar2;
                  auVar24._8_4_ = uVar2;
                  auVar24._20_4_ = uVar2;
                  auVar24._16_4_ = uVar2;
                  auVar24._28_4_ = uVar2;
                  auVar24._24_4_ = uVar2;
                  uVar2 = puVar1[4];
                  auVar23._4_4_ = uVar2;
                  auVar23._0_4_ = uVar2;
                  auVar23._12_4_ = uVar2;
                  auVar23._8_4_ = uVar2;
                  auVar23._20_4_ = uVar2;
                  auVar23._16_4_ = uVar2;
                  auVar23._28_4_ = uVar2;
                  auVar23._24_4_ = uVar2;
                  uVar2 = puVar1[5];
                  auVar22._4_4_ = uVar2;
                  auVar22._0_4_ = uVar2;
                  auVar22._12_4_ = uVar2;
                  auVar22._8_4_ = uVar2;
                  auVar22._20_4_ = uVar2;
                  auVar22._16_4_ = uVar2;
                  auVar22._28_4_ = uVar2;
                  auVar22._24_4_ = uVar2;
                  uVar2 = puVar1[6];
                  auVar21._4_4_ = uVar2;
                  auVar21._0_4_ = uVar2;
                  auVar21._12_4_ = uVar2;
                  auVar21._8_4_ = uVar2;
                  auVar21._20_4_ = uVar2;
                  auVar21._16_4_ = uVar2;
                  auVar21._28_4_ = uVar2;
                  auVar21._24_4_ = uVar2;
                  uVar2 = puVar1[7];
                  auVar20._4_4_ = uVar2;
                  auVar20._0_4_ = uVar2;
                  auVar20._12_4_ = uVar2;
                  auVar20._8_4_ = uVar2;
                  auVar20._20_4_ = uVar2;
                  auVar20._16_4_ = uVar2;
                  auVar20._28_4_ = uVar2;
                  auVar20._24_4_ = uVar2;
                  uVar2 = puVar1[8];
                  auVar19._4_4_ = uVar2;
                  auVar19._0_4_ = uVar2;
                  auVar19._12_4_ = uVar2;
                  auVar19._8_4_ = uVar2;
                  auVar19._20_4_ = uVar2;
                  auVar19._16_4_ = uVar2;
                  auVar19._28_4_ = uVar2;
                  auVar19._24_4_ = uVar2;
                  uVar2 = puVar1[9];
                  auVar18._4_4_ = uVar2;
                  auVar18._0_4_ = uVar2;
                  auVar18._12_4_ = uVar2;
                  auVar18._8_4_ = uVar2;
                  auVar18._20_4_ = uVar2;
                  auVar18._16_4_ = uVar2;
                  auVar18._28_4_ = uVar2;
                  auVar18._24_4_ = uVar2;
                  uVar2 = puVar1[10];
                  auVar17._4_4_ = uVar2;
                  auVar17._0_4_ = uVar2;
                  auVar17._12_4_ = uVar2;
                  auVar17._8_4_ = uVar2;
                  auVar17._20_4_ = uVar2;
                  auVar17._16_4_ = uVar2;
                  auVar17._28_4_ = uVar2;
                  auVar17._24_4_ = uVar2;
                  uVar2 = puVar1[0xb];
                  auVar16._4_4_ = uVar2;
                  auVar16._0_4_ = uVar2;
                  auVar16._12_4_ = uVar2;
                  auVar16._8_4_ = uVar2;
                  auVar16._20_4_ = uVar2;
                  auVar16._16_4_ = uVar2;
                  auVar16._28_4_ = uVar2;
                  auVar16._24_4_ = uVar2;
                  uVar2 = puVar1[0xc];
                  auVar12._4_4_ = uVar2;
                  auVar12._0_4_ = uVar2;
                  auVar12._12_4_ = uVar2;
                  auVar12._8_4_ = uVar2;
                  auVar12._20_4_ = uVar2;
                  auVar12._16_4_ = uVar2;
                  auVar12._28_4_ = uVar2;
                  auVar12._24_4_ = uVar2;
                  uVar2 = puVar1[0xd];
                  auVar11._4_4_ = uVar2;
                  auVar11._0_4_ = uVar2;
                  auVar11._12_4_ = uVar2;
                  auVar11._8_4_ = uVar2;
                  auVar11._20_4_ = uVar2;
                  auVar11._16_4_ = uVar2;
                  auVar11._28_4_ = uVar2;
                  auVar11._24_4_ = uVar2;
                  uVar2 = puVar1[0xe];
                  auVar116._4_4_ = uVar2;
                  auVar116._0_4_ = uVar2;
                  auVar116._12_4_ = uVar2;
                  auVar116._8_4_ = uVar2;
                  auVar116._20_4_ = uVar2;
                  auVar116._16_4_ = uVar2;
                  auVar116._28_4_ = uVar2;
                  auVar116._24_4_ = uVar2;
                  uVar2 = puVar1[0xf];
                  auVar10._4_4_ = uVar2;
                  auVar10._0_4_ = uVar2;
                  auVar10._12_4_ = uVar2;
                  auVar10._8_4_ = uVar2;
                  auVar10._20_4_ = uVar2;
                  auVar10._16_4_ = uVar2;
                  auVar10._28_4_ = uVar2;
                  auVar10._24_4_ = uVar2;
                  auVar27._8_8_ = uStack_40f8;
                  auVar27._0_8_ = local_4100;
                  auVar27._16_8_ = uStack_40f0;
                  auVar27._24_8_ = uStack_40e8;
                  auVar13 = vfmadd213ps_fma(*(undefined1 (*) [32])(local_4108 + (long)iVar114 * 4),
                                            auVar28,auVar27);
                  auVar13 = vfmadd213ps_fma(*(undefined1 (*) [32])
                                             (local_4108 + (long)iVar114 * 4 + 0x20),auVar26,
                                            ZEXT1632(auVar13));
                  auVar13 = vfmadd213ps_fma(*(undefined1 (*) [32])
                                             (local_4108 + (long)iVar114 * 4 + 0x40),auVar25,
                                            ZEXT1632(auVar13));
                  auVar13 = vfmadd213ps_fma(*(undefined1 (*) [32])
                                             (local_4108 + (long)iVar114 * 4 + 0x60),auVar24,
                                            ZEXT1632(auVar13));
                  auVar13 = vfmadd213ps_fma(*(undefined1 (*) [32])
                                             (local_4108 + (long)iVar114 * 4 + 0x80),auVar23,
                                            ZEXT1632(auVar13));
                  auVar13 = vfmadd213ps_fma(*(undefined1 (*) [32])
                                             (local_4108 + (long)iVar114 * 4 + 0xa0),auVar22,
                                            ZEXT1632(auVar13));
                  auVar13 = vfmadd213ps_fma(*(undefined1 (*) [32])
                                             (local_4108 + (long)iVar114 * 4 + 0xc0),auVar21,
                                            ZEXT1632(auVar13));
                  auVar13 = vfmadd213ps_fma(*(undefined1 (*) [32])
                                             (local_4108 + (long)iVar114 * 4 + 0xe0),auVar20,
                                            ZEXT1632(auVar13));
                  auVar13 = vfmadd213ps_fma(*(undefined1 (*) [32])
                                             (local_4108 + (long)iVar114 * 4 + 0x100),auVar19,
                                            ZEXT1632(auVar13));
                  auVar13 = vfmadd213ps_fma(*(undefined1 (*) [32])
                                             (local_4108 + (long)iVar114 * 4 + 0x120),auVar18,
                                            ZEXT1632(auVar13));
                  auVar13 = vfmadd213ps_fma(*(undefined1 (*) [32])
                                             (local_4108 + (long)iVar114 * 4 + 0x140),auVar17,
                                            ZEXT1632(auVar13));
                  auVar13 = vfmadd213ps_fma(*(undefined1 (*) [32])
                                             (local_4108 + (long)iVar114 * 4 + 0x160),auVar16,
                                            ZEXT1632(auVar13));
                  auVar13 = vfmadd213ps_fma(*(undefined1 (*) [32])
                                             (local_4108 + (long)iVar114 * 4 + 0x180),auVar12,
                                            ZEXT1632(auVar13));
                  auVar13 = vfmadd213ps_fma(*(undefined1 (*) [32])
                                             (local_4108 + (long)iVar114 * 4 + 0x1a0),auVar11,
                                            ZEXT1632(auVar13));
                  auVar13 = vfmadd213ps_fma(*(undefined1 (*) [32])
                                             (local_4108 + (long)iVar114 * 4 + 0x1c0),auVar116,
                                            ZEXT1632(auVar13));
                  auVar13 = vfmadd213ps_fma(*(undefined1 (*) [32])
                                             (local_4108 + (long)iVar114 * 4 + 0x1e0),auVar10,
                                            ZEXT1632(auVar13));
                  local_4a60 = auVar13._0_8_;
                  uStack_4a58 = auVar13._8_8_;
                  local_4100 = local_4a60;
                  uStack_40f8 = uStack_4a58;
                  uStack_40f0 = 0;
                  uStack_40e8 = 0;
                }
              }
            }
          }
          local_4108 = local_4108 + (long)(in_R8D * in_R9D * 0x80) * 4;
        }
        plVar15 = (long *)CONCAT44(in_stack_00000034,activation_type);
        local_2c20 = (float)local_4100;
        fStack_2c1c = (float)((ulong)local_4100 >> 0x20);
        fStack_2c18 = (float)uStack_40f8;
        fStack_2c14 = (float)((ulong)uStack_40f8 >> 0x20);
        fStack_2c10 = (float)uStack_40f0;
        fStack_2c0c = (float)((ulong)uStack_40f0 >> 0x20);
        fStack_2c08 = (float)uStack_40e8;
        switch(stride_h) {
        case 1:
          auVar29._8_8_ = uStack_40f8;
          auVar29._0_8_ = local_4100;
          auVar29._16_8_ = uStack_40f0;
          auVar29._24_8_ = uStack_40e8;
          _local_3200 = vmaxps_avx(auVar29,ZEXT1632(ZEXT816(0)));
          break;
        case 2:
          uVar3 = *(uint *)*plVar15;
          auVar32._8_8_ = uStack_40f8;
          auVar32._0_8_ = local_4100;
          auVar32._16_8_ = uStack_40f0;
          auVar32._24_8_ = uStack_40e8;
          auVar10 = vmaxps_avx(ZEXT1632(ZEXT816(0)),auVar32);
          auVar33._8_8_ = uStack_40f8;
          auVar33._0_8_ = local_4100;
          auVar33._16_8_ = uStack_40f0;
          auVar33._24_8_ = uStack_40e8;
          auVar116 = vminps_avx(ZEXT1632(ZEXT816(0)),auVar33);
          auVar13 = vinsertps_avx(ZEXT416(uVar3),ZEXT416(uVar3),0x10);
          auVar13 = vinsertps_avx(auVar13,ZEXT416(uVar3),0x20);
          auVar13 = vinsertps_avx(auVar13,ZEXT416(uVar3),0x30);
          auVar8 = vinsertps_avx(ZEXT416(uVar3),ZEXT416(uVar3),0x10);
          auVar8 = vinsertps_avx(auVar8,ZEXT416(uVar3),0x20);
          auVar8 = vinsertps_avx(auVar8,ZEXT416(uVar3),0x30);
          local_2be0 = auVar8._0_4_;
          fStack_2bdc = auVar8._4_4_;
          fStack_2bd8 = auVar8._8_4_;
          fStack_2bd4 = auVar8._12_4_;
          fStack_2bd0 = auVar13._0_4_;
          fStack_2bcc = auVar13._4_4_;
          fStack_2bc8 = auVar13._8_4_;
          fStack_2bc4 = auVar13._12_4_;
          local_2c00 = auVar116._0_4_;
          fStack_2bfc = auVar116._4_4_;
          fStack_2bf8 = auVar116._8_4_;
          fStack_2bf4 = auVar116._12_4_;
          fStack_2bf0 = auVar116._16_4_;
          fStack_2bec = auVar116._20_4_;
          fStack_2be8 = auVar116._24_4_;
          local_3000 = auVar10._0_4_;
          fStack_2ffc = auVar10._4_4_;
          fStack_2ff8 = auVar10._8_4_;
          fStack_2ff4 = auVar10._12_4_;
          fStack_2ff0 = auVar10._16_4_;
          fStack_2fec = auVar10._20_4_;
          fStack_2fe8 = auVar10._24_4_;
          fStack_2fe4 = auVar10._28_4_;
          local_3200._4_4_ = fStack_2ffc + fStack_2bdc * fStack_2bfc;
          local_3200._0_4_ = local_3000 + local_2be0 * local_2c00;
          uStack_31f8._0_4_ = fStack_2ff8 + fStack_2bd8 * fStack_2bf8;
          uStack_31f8._4_4_ = fStack_2ff4 + fStack_2bd4 * fStack_2bf4;
          uStack_31f0._0_4_ = fStack_2ff0 + fStack_2bd0 * fStack_2bf0;
          uStack_31f0._4_4_ = fStack_2fec + fStack_2bcc * fStack_2bec;
          uStack_31e8._0_4_ = fStack_2fe8 + fStack_2bc8 * fStack_2be8;
          uStack_31e8._4_4_ = fStack_2fe4 + fStack_2bc4;
          break;
        case 3:
          uVar3 = *(uint *)*plVar15;
          auVar13 = vinsertps_avx(ZEXT416(uVar3),ZEXT416(uVar3),0x10);
          auVar13 = vinsertps_avx(auVar13,ZEXT416(uVar3),0x20);
          auVar13 = vinsertps_avx(auVar13,ZEXT416(uVar3),0x30);
          auVar8 = vinsertps_avx(ZEXT416(uVar3),ZEXT416(uVar3),0x10);
          auVar8 = vinsertps_avx(auVar8,ZEXT416(uVar3),0x20);
          auVar8 = vinsertps_avx(auVar8,ZEXT416(uVar3),0x30);
          uStack_2a70 = auVar8._0_8_;
          uStack_2a68 = auVar8._8_8_;
          uVar3 = *(uint *)(*plVar15 + 4);
          auVar8 = vinsertps_avx(ZEXT416(uVar3),ZEXT416(uVar3),0x10);
          auVar8 = vinsertps_avx(auVar8,ZEXT416(uVar3),0x20);
          auVar8 = vinsertps_avx(auVar8,ZEXT416(uVar3),0x30);
          auVar9 = vinsertps_avx(ZEXT416(uVar3),ZEXT416(uVar3),0x10);
          auVar9 = vinsertps_avx(auVar9,ZEXT416(uVar3),0x20);
          auVar9 = vinsertps_avx(auVar9,ZEXT416(uVar3),0x30);
          uStack_2a30 = auVar8._0_8_;
          uStack_2a28 = auVar8._8_8_;
          auVar31._8_8_ = uStack_40f8;
          auVar31._0_8_ = local_4100;
          auVar31._16_8_ = uStack_40f0;
          auVar31._24_8_ = uStack_40e8;
          auVar30._16_8_ = uStack_2a70;
          auVar30._0_16_ = auVar13;
          auVar30._24_8_ = uStack_2a68;
          auVar10 = vmaxps_avx(auVar31,auVar30);
          auVar34._16_8_ = uStack_2a30;
          auVar34._0_16_ = auVar9;
          auVar34._24_8_ = uStack_2a28;
          _local_3200 = vminps_avx(auVar10,auVar34);
          break;
        case 4:
          auVar13 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar13 = vinsertps_avx(auVar13,ZEXT416(0x3f800000),0x20);
          auVar13 = vinsertps_avx(auVar13,ZEXT416(0x3f800000),0x30);
          auVar8 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar8 = vinsertps_avx(auVar8,ZEXT416(0x3f800000),0x20);
          auVar8 = vinsertps_avx(auVar8,ZEXT416(0x3f800000),0x30);
          uStack_2b30 = auVar8._0_8_;
          uStack_2b28 = auVar8._8_8_;
          auVar43._8_8_ = uStack_40f8;
          auVar43._0_8_ = local_4100;
          auVar43._16_8_ = uStack_40f0;
          auVar43._24_8_ = uStack_40e8;
          auVar10 = vsubps_avx(ZEXT1632(ZEXT816(0)),auVar43);
          auVar42._8_4_ = 0x42b0c0a5;
          auVar42._0_8_ = 0x42b0c0a542b0c0a5;
          auVar42._12_4_ = 0x42b0c0a5;
          auVar42._16_4_ = 0x42b0c0a5;
          auVar42._20_4_ = 0x42b0c0a5;
          auVar42._24_4_ = 0x42b0c0a5;
          auVar42._28_4_ = 0x42b0c0a5;
          auVar10 = vminps_avx(auVar10,auVar42);
          auVar41._8_4_ = 0xc2b0c0a5;
          auVar41._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar41._12_4_ = 0xc2b0c0a5;
          auVar41._16_4_ = 0xc2b0c0a5;
          auVar41._20_4_ = 0xc2b0c0a5;
          auVar41._24_4_ = 0xc2b0c0a5;
          auVar41._28_4_ = 0xc2b0c0a5;
          auVar116 = vmaxps_avx(auVar10,auVar41);
          auVar50._8_4_ = 1.442695;
          auVar50._12_4_ = 1.442695;
          auVar50._0_4_ = 1.442695;
          auVar50._4_4_ = 1.442695;
          auVar50._16_4_ = 1.442695;
          auVar50._20_4_ = 1.442695;
          auVar50._24_4_ = 1.442695;
          auVar50._28_4_ = 1.442695;
          auVar49._8_4_ = 0.5;
          auVar49._12_4_ = 0.5;
          auVar49._0_4_ = 0.5;
          auVar49._4_4_ = 0.5;
          auVar49._16_4_ = 0.5;
          auVar49._20_4_ = 0.5;
          auVar49._24_4_ = 0.5;
          auVar49._28_4_ = 0.5;
          auVar9 = vfmadd213ps_fma(auVar50,auVar116,auVar49);
          auVar11 = vroundps_avx(ZEXT1632(auVar9),1);
          auVar10 = vcmpps_avx(ZEXT1632(auVar9),auVar11,1);
          auVar58._8_8_ = 0x3f8000003f800000;
          auVar58._0_8_ = 0x3f8000003f800000;
          auVar58._16_8_ = 0x3f8000003f800000;
          auVar58._24_8_ = 0x3f8000003f800000;
          auVar10 = vpand_avx2(auVar10,auVar58);
          auVar10 = vsubps_avx(auVar11,auVar10);
          auVar62._8_4_ = 0.6933594;
          auVar62._12_4_ = 0.6933594;
          auVar62._0_4_ = 0.6933594;
          auVar62._4_4_ = 0.6933594;
          auVar62._16_4_ = 0.6933594;
          auVar62._20_4_ = 0.6933594;
          auVar62._24_4_ = 0.6933594;
          auVar62._28_4_ = 0.6933594;
          auVar9 = vfnmadd213ps_fma(auVar62,auVar10,auVar116);
          auVar63._8_4_ = -0.00021219444;
          auVar63._12_4_ = -0.00021219444;
          auVar63._0_4_ = -0.00021219444;
          auVar63._4_4_ = -0.00021219444;
          auVar63._16_4_ = -0.00021219444;
          auVar63._20_4_ = -0.00021219444;
          auVar63._24_4_ = -0.00021219444;
          auVar63._28_4_ = -0.00021219444;
          auVar9 = vfnmadd213ps_fma(auVar63,auVar10,ZEXT1632(auVar9));
          auVar116 = ZEXT1632(auVar9);
          local_24e0 = auVar9._0_4_;
          fStack_24dc = auVar9._4_4_;
          fStack_24d8 = auVar9._8_4_;
          fStack_24d4 = auVar9._12_4_;
          _local_2660 = ZEXT1632(CONCAT412(fStack_24d4 * fStack_24d4,
                                           CONCAT48(fStack_24d8 * fStack_24d8,
                                                    CONCAT44(fStack_24dc * fStack_24dc,
                                                             local_24e0 * local_24e0))));
          local_2700._8_4_ = 0x39506967;
          local_2700._0_8_ = 0x3950696739506967;
          local_2700._12_4_ = 0x39506967;
          local_2700._16_4_ = 0x39506967;
          local_2700._20_4_ = 0x39506967;
          local_2700._24_4_ = 0x39506967;
          local_2700._28_4_ = 0x39506967;
          auVar48._8_4_ = 0.0013981999;
          auVar48._12_4_ = 0.0013981999;
          auVar48._0_4_ = 0.0013981999;
          auVar48._4_4_ = 0.0013981999;
          auVar48._16_4_ = 0.0013981999;
          auVar48._20_4_ = 0.0013981999;
          auVar48._24_4_ = 0.0013981999;
          auVar48._28_4_ = 0.0013981999;
          auVar9 = vfmadd213ps_fma(auVar116,local_2700,auVar48);
          auVar47._8_4_ = 0.008333452;
          auVar47._12_4_ = 0.008333452;
          auVar47._0_4_ = 0.008333452;
          auVar47._4_4_ = 0.008333452;
          auVar47._16_4_ = 0.008333452;
          auVar47._20_4_ = 0.008333452;
          auVar47._24_4_ = 0.008333452;
          auVar47._28_4_ = 0.008333452;
          auVar9 = vfmadd213ps_fma(auVar116,ZEXT1632(auVar9),auVar47);
          auVar46._8_4_ = 0.041665796;
          auVar46._12_4_ = 0.041665796;
          auVar46._0_4_ = 0.041665796;
          auVar46._4_4_ = 0.041665796;
          auVar46._16_4_ = 0.041665796;
          auVar46._20_4_ = 0.041665796;
          auVar46._24_4_ = 0.041665796;
          auVar46._28_4_ = 0.041665796;
          auVar9 = vfmadd213ps_fma(auVar116,ZEXT1632(auVar9),auVar46);
          auVar45._8_4_ = 0.16666666;
          auVar45._12_4_ = 0.16666666;
          auVar45._0_4_ = 0.16666666;
          auVar45._4_4_ = 0.16666666;
          auVar45._16_4_ = 0.16666666;
          auVar45._20_4_ = 0.16666666;
          auVar45._24_4_ = 0.16666666;
          auVar45._28_4_ = 0.16666666;
          auVar9 = vfmadd213ps_fma(auVar116,ZEXT1632(auVar9),auVar45);
          auVar44._8_4_ = 0.5;
          auVar44._12_4_ = 0.5;
          auVar44._0_4_ = 0.5;
          auVar44._4_4_ = 0.5;
          auVar44._16_4_ = 0.5;
          auVar44._20_4_ = 0.5;
          auVar44._24_4_ = 0.5;
          auVar44._28_4_ = 0.5;
          auVar9 = vfmadd213ps_fma(auVar116,ZEXT1632(auVar9),auVar44);
          auVar9 = vfmadd213ps_fma(_local_2660,ZEXT1632(auVar9),auVar116);
          local_25e0 = auVar9._0_4_;
          fStack_25dc = auVar9._4_4_;
          fStack_25d8 = auVar9._8_4_;
          fStack_25d4 = auVar9._12_4_;
          local_1ba0 = auVar10._0_4_;
          fStack_1b9c = auVar10._4_4_;
          fStack_1b98 = auVar10._8_4_;
          fStack_1b94 = auVar10._12_4_;
          fStack_1b90 = auVar10._16_4_;
          fStack_1b8c = auVar10._20_4_;
          fStack_1b88 = auVar10._24_4_;
          fStack_1b84 = auVar10._28_4_;
          local_26a0._4_4_ = (int)fStack_1b9c;
          local_26a0._0_4_ = (int)local_1ba0;
          local_26a0._8_4_ = (int)fStack_1b98;
          local_26a0._12_4_ = (int)fStack_1b94;
          uStack_2690._0_4_ = (int)fStack_1b90;
          uStack_2690._4_4_ = (int)fStack_1b8c;
          uStack_2688._0_4_ = (int)fStack_1b88;
          uStack_2688._4_4_ = (int)fStack_1b84;
          auVar10 = _local_26a0;
          uStack_2688 = auVar10._24_8_;
          auVar67._16_8_ = uStack_2690;
          auVar67._0_16_ = local_26a0;
          auVar67._24_8_ = uStack_2688;
          auVar66._8_8_ = 0x7f0000007f;
          auVar66._0_8_ = 0x7f0000007f;
          auVar66._16_8_ = 0x7f0000007f;
          auVar66._24_8_ = 0x7f0000007f;
          auVar10 = vpaddd_avx2(auVar67,auVar66);
          auVar10 = vpslld_avx2(auVar10,ZEXT416(0x17));
          local_2540 = auVar10._0_4_;
          fStack_253c = auVar10._4_4_;
          fStack_2538 = auVar10._8_4_;
          fStack_2534 = auVar10._12_4_;
          fStack_2530 = auVar10._16_4_;
          fStack_252c = auVar10._20_4_;
          fStack_2528 = auVar10._24_4_;
          local_2e80 = auVar13._0_4_;
          fStack_2e7c = auVar13._4_4_;
          fStack_2e78 = auVar13._8_4_;
          fStack_2e74 = auVar13._12_4_;
          fStack_2e70 = auVar8._0_4_;
          fStack_2e6c = auVar8._4_4_;
          fStack_2e68 = auVar8._8_4_;
          fStack_2e64 = auVar8._12_4_;
          auVar37._16_8_ = uStack_2b30;
          auVar37._0_16_ = auVar13;
          auVar37._24_8_ = uStack_2b28;
          auVar36._4_4_ = fStack_2e7c + (fStack_25dc + 1.0) * fStack_253c;
          auVar36._0_4_ = local_2e80 + (local_25e0 + 1.0) * local_2540;
          auVar36._8_4_ = fStack_2e78 + (fStack_25d8 + 1.0) * fStack_2538;
          auVar36._12_4_ = fStack_2e74 + (fStack_25d4 + 1.0) * fStack_2534;
          auVar36._16_4_ = fStack_2e70 + fStack_2530 * 1.0;
          auVar36._20_4_ = fStack_2e6c + fStack_252c * 1.0;
          auVar36._24_4_ = fStack_2e68 + fStack_2528 * 1.0;
          auVar36._28_4_ = fStack_2e64 + 1.0;
          _local_3200 = vdivps_avx(auVar37,auVar36);
          break;
        case 5:
          local_28a0._8_8_ = uStack_40f8;
          local_28a0._0_8_ = local_4100;
          auVar40._16_8_ = uStack_40f0;
          auVar40._0_16_ = local_28a0;
          auVar40._24_8_ = uStack_40e8;
          auVar39._8_4_ = 0x42b0c0a5;
          auVar39._0_8_ = 0x42b0c0a542b0c0a5;
          auVar39._12_4_ = 0x42b0c0a5;
          auVar39._16_4_ = 0x42b0c0a5;
          auVar39._20_4_ = 0x42b0c0a5;
          auVar39._24_4_ = 0x42b0c0a5;
          auVar39._28_4_ = 0x42b0c0a5;
          auVar10 = vminps_avx(auVar40,auVar39);
          auVar38._8_4_ = 0xc2b0c0a5;
          auVar38._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar38._12_4_ = 0xc2b0c0a5;
          auVar38._16_4_ = 0xc2b0c0a5;
          auVar38._20_4_ = 0xc2b0c0a5;
          auVar38._24_4_ = 0xc2b0c0a5;
          auVar38._28_4_ = 0xc2b0c0a5;
          auVar116 = vmaxps_avx(auVar10,auVar38);
          auVar57._8_4_ = 1.442695;
          auVar57._12_4_ = 1.442695;
          auVar57._0_4_ = 1.442695;
          auVar57._4_4_ = 1.442695;
          auVar57._16_4_ = 1.442695;
          auVar57._20_4_ = 1.442695;
          auVar57._24_4_ = 1.442695;
          auVar57._28_4_ = 1.442695;
          auVar56._8_4_ = 0.5;
          auVar56._12_4_ = 0.5;
          auVar56._0_4_ = 0.5;
          auVar56._4_4_ = 0.5;
          auVar56._16_4_ = 0.5;
          auVar56._20_4_ = 0.5;
          auVar56._24_4_ = 0.5;
          auVar56._28_4_ = 0.5;
          auVar13 = vfmadd213ps_fma(auVar57,auVar116,auVar56);
          auVar11 = vroundps_avx(ZEXT1632(auVar13),1);
          auVar10 = vcmpps_avx(ZEXT1632(auVar13),auVar11,1);
          auVar59._8_8_ = 0x3f8000003f800000;
          auVar59._0_8_ = 0x3f8000003f800000;
          auVar59._16_8_ = 0x3f8000003f800000;
          auVar59._24_8_ = 0x3f8000003f800000;
          auVar10 = vpand_avx2(auVar10,auVar59);
          auVar10 = vsubps_avx(auVar11,auVar10);
          auVar60._8_4_ = 0.6933594;
          auVar60._12_4_ = 0.6933594;
          auVar60._0_4_ = 0.6933594;
          auVar60._4_4_ = 0.6933594;
          auVar60._16_4_ = 0.6933594;
          auVar60._20_4_ = 0.6933594;
          auVar60._24_4_ = 0.6933594;
          auVar60._28_4_ = 0.6933594;
          auVar13 = vfnmadd213ps_fma(auVar60,auVar10,auVar116);
          auVar61._8_4_ = -0.00021219444;
          auVar61._12_4_ = -0.00021219444;
          auVar61._0_4_ = -0.00021219444;
          auVar61._4_4_ = -0.00021219444;
          auVar61._16_4_ = -0.00021219444;
          auVar61._20_4_ = -0.00021219444;
          auVar61._24_4_ = -0.00021219444;
          auVar61._28_4_ = -0.00021219444;
          auVar13 = vfnmadd213ps_fma(auVar61,auVar10,ZEXT1632(auVar13));
          auVar116 = ZEXT1632(auVar13);
          local_2740 = auVar13._0_4_;
          fStack_273c = auVar13._4_4_;
          fStack_2738 = auVar13._8_4_;
          fStack_2734 = auVar13._12_4_;
          _local_28c0 = ZEXT1632(CONCAT412(fStack_2734 * fStack_2734,
                                           CONCAT48(fStack_2738 * fStack_2738,
                                                    CONCAT44(fStack_273c * fStack_273c,
                                                             local_2740 * local_2740))));
          local_2960._8_4_ = 0x39506967;
          local_2960._0_8_ = 0x3950696739506967;
          local_2960._12_4_ = 0x39506967;
          local_2960._16_4_ = 0x39506967;
          local_2960._20_4_ = 0x39506967;
          local_2960._24_4_ = 0x39506967;
          local_2960._28_4_ = 0x39506967;
          auVar55._8_4_ = 0.0013981999;
          auVar55._12_4_ = 0.0013981999;
          auVar55._0_4_ = 0.0013981999;
          auVar55._4_4_ = 0.0013981999;
          auVar55._16_4_ = 0.0013981999;
          auVar55._20_4_ = 0.0013981999;
          auVar55._24_4_ = 0.0013981999;
          auVar55._28_4_ = 0.0013981999;
          auVar13 = vfmadd213ps_fma(auVar116,local_2960,auVar55);
          auVar54._8_4_ = 0.008333452;
          auVar54._12_4_ = 0.008333452;
          auVar54._0_4_ = 0.008333452;
          auVar54._4_4_ = 0.008333452;
          auVar54._16_4_ = 0.008333452;
          auVar54._20_4_ = 0.008333452;
          auVar54._24_4_ = 0.008333452;
          auVar54._28_4_ = 0.008333452;
          auVar13 = vfmadd213ps_fma(auVar116,ZEXT1632(auVar13),auVar54);
          auVar53._8_4_ = 0.041665796;
          auVar53._12_4_ = 0.041665796;
          auVar53._0_4_ = 0.041665796;
          auVar53._4_4_ = 0.041665796;
          auVar53._16_4_ = 0.041665796;
          auVar53._20_4_ = 0.041665796;
          auVar53._24_4_ = 0.041665796;
          auVar53._28_4_ = 0.041665796;
          auVar13 = vfmadd213ps_fma(auVar116,ZEXT1632(auVar13),auVar53);
          auVar52._8_4_ = 0.16666666;
          auVar52._12_4_ = 0.16666666;
          auVar52._0_4_ = 0.16666666;
          auVar52._4_4_ = 0.16666666;
          auVar52._16_4_ = 0.16666666;
          auVar52._20_4_ = 0.16666666;
          auVar52._24_4_ = 0.16666666;
          auVar52._28_4_ = 0.16666666;
          auVar13 = vfmadd213ps_fma(auVar116,ZEXT1632(auVar13),auVar52);
          auVar51._8_4_ = 0.5;
          auVar51._12_4_ = 0.5;
          auVar51._0_4_ = 0.5;
          auVar51._4_4_ = 0.5;
          auVar51._16_4_ = 0.5;
          auVar51._20_4_ = 0.5;
          auVar51._24_4_ = 0.5;
          auVar51._28_4_ = 0.5;
          auVar13 = vfmadd213ps_fma(auVar116,ZEXT1632(auVar13),auVar51);
          auVar13 = vfmadd213ps_fma(_local_28c0,ZEXT1632(auVar13),auVar116);
          local_2840 = auVar13._0_4_;
          fStack_283c = auVar13._4_4_;
          fStack_2838 = auVar13._8_4_;
          fStack_2834 = auVar13._12_4_;
          local_1b80 = auVar10._0_4_;
          fStack_1b7c = auVar10._4_4_;
          fStack_1b78 = auVar10._8_4_;
          fStack_1b74 = auVar10._12_4_;
          fStack_1b70 = auVar10._16_4_;
          fStack_1b6c = auVar10._20_4_;
          fStack_1b68 = auVar10._24_4_;
          fStack_1b64 = auVar10._28_4_;
          local_2900._4_4_ = (int)fStack_1b7c;
          local_2900._0_4_ = (int)local_1b80;
          local_2900._8_4_ = (int)fStack_1b78;
          local_2900._12_4_ = (int)fStack_1b74;
          uStack_28f0._0_4_ = (int)fStack_1b70;
          uStack_28f0._4_4_ = (int)fStack_1b6c;
          uStack_28e8._0_4_ = (int)fStack_1b68;
          uStack_28e8._4_4_ = (int)fStack_1b64;
          auVar10 = _local_2900;
          uStack_28e8 = auVar10._24_8_;
          auVar65._16_8_ = uStack_28f0;
          auVar65._0_16_ = local_2900;
          auVar65._24_8_ = uStack_28e8;
          auVar64._8_8_ = 0x7f0000007f;
          auVar64._0_8_ = 0x7f0000007f;
          auVar64._16_8_ = 0x7f0000007f;
          auVar64._24_8_ = 0x7f0000007f;
          auVar10 = vpaddd_avx2(auVar64,auVar65);
          auVar10 = vpslld_avx2(auVar10,ZEXT416(0x17));
          local_27a0 = auVar10._0_4_;
          fStack_279c = auVar10._4_4_;
          fStack_2798 = auVar10._8_4_;
          fStack_2794 = auVar10._12_4_;
          fStack_2790 = auVar10._16_4_;
          fStack_278c = auVar10._20_4_;
          fStack_2788 = auVar10._24_4_;
          auVar13 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar13 = vinsertps_avx(auVar13,ZEXT416(0x3f800000),0x20);
          auVar13 = vinsertps_avx(auVar13,ZEXT416(0x3f800000),0x30);
          auVar8 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar8 = vinsertps_avx(auVar8,ZEXT416(0x3f800000),0x20);
          auVar8 = vinsertps_avx(auVar8,ZEXT416(0x3f800000),0x30);
          local_2e20 = auVar13._0_4_;
          fStack_2e1c = auVar13._4_4_;
          fStack_2e18 = auVar13._8_4_;
          fStack_2e14 = auVar13._12_4_;
          fStack_2e10 = auVar8._0_4_;
          fStack_2e0c = auVar8._4_4_;
          fStack_2e08 = auVar8._8_4_;
          fStack_2e04 = auVar8._12_4_;
          local_b40._4_4_ = fStack_2e1c + fStack_279c * (fStack_283c + 1.0);
          local_b40._0_4_ = local_2e20 + local_27a0 * (local_2840 + 1.0);
          fStack_b38 = fStack_2e18 + fStack_2798 * (fStack_2838 + 1.0);
          fStack_b34 = fStack_2e14 + fStack_2794 * (fStack_2834 + 1.0);
          uStack_b30._0_4_ = fStack_2e10 + fStack_2790 * 1.0;
          uStack_b30._4_4_ = fStack_2e0c + fStack_278c * 1.0;
          uStack_b28._0_4_ = fStack_2e08 + fStack_2788 * 1.0;
          uStack_b28._4_4_ = fStack_2e04 + 1.0;
          auVar116 = _local_b40;
          auVar10 = vcmpps_avx(_local_b40,ZEXT1632(ZEXT816(0)),2);
          uStack_b28 = auVar116._24_8_;
          auVar86._16_8_ = uStack_b30;
          auVar86._0_16_ = _local_b40;
          auVar86._24_8_ = uStack_b28;
          auVar85._8_4_ = 0x800000;
          auVar85._0_8_ = 0x80000000800000;
          auVar85._12_4_ = 0x800000;
          auVar85._16_4_ = 0x800000;
          auVar85._20_4_ = 0x800000;
          auVar85._24_4_ = 0x800000;
          auVar85._28_4_ = 0x800000;
          auVar116 = vmaxps_avx(auVar85,auVar86);
          auVar12 = vpsrld_avx2(auVar116,ZEXT416(0x17));
          auVar100._8_4_ = 0x807fffff;
          auVar100._0_8_ = 0x807fffff807fffff;
          auVar100._12_4_ = 0x807fffff;
          auVar100._16_4_ = 0x807fffff;
          auVar100._20_4_ = 0x807fffff;
          auVar100._24_4_ = 0x807fffff;
          auVar100._28_4_ = 0x807fffff;
          auVar116 = vpand_avx2(auVar100,auVar116);
          auVar104._8_4_ = 0x3f000000;
          auVar104._0_8_ = 0x3f0000003f000000;
          auVar104._12_4_ = 0x3f000000;
          auVar104._16_4_ = 0x3f000000;
          auVar104._20_4_ = 0x3f000000;
          auVar104._24_4_ = 0x3f000000;
          auVar104._28_4_ = 0x3f000000;
          auVar11 = vpor_avx2(auVar104,auVar116);
          auVar105._8_8_ = 0x7f0000007f;
          auVar105._0_8_ = 0x7f0000007f;
          auVar105._16_8_ = 0x7f0000007f;
          auVar105._24_8_ = 0x7f0000007f;
          auVar116 = vpsubd_avx2(auVar12,auVar105);
          auVar116 = vcvtdq2ps_avx(auVar116);
          local_a60 = auVar116._0_4_;
          fStack_a5c = auVar116._4_4_;
          fStack_a58 = auVar116._8_4_;
          fStack_a54 = auVar116._12_4_;
          fStack_a50 = auVar116._16_4_;
          fStack_a4c = auVar116._20_4_;
          fStack_a48 = auVar116._24_4_;
          fStack_a44 = auVar116._28_4_;
          local_bc0._4_4_ = fStack_a5c + 1.0;
          local_bc0._0_4_ = local_a60 + 1.0;
          fStack_bb8 = fStack_a58 + 1.0;
          fStack_bb4 = fStack_a54 + 1.0;
          uStack_bb0._0_4_ = fStack_a50 + 1.0;
          uStack_bb0._4_4_ = fStack_a4c + 1.0;
          uStack_ba8._0_4_ = fStack_a48 + 1.0;
          uStack_ba8._4_4_ = fStack_a44 + 1.0;
          auVar16 = _local_bc0;
          auVar118._8_4_ = 0x3f3504f3;
          auVar118._0_8_ = 0x3f3504f33f3504f3;
          auVar118._12_4_ = 0x3f3504f3;
          auVar118._16_4_ = 0x3f3504f3;
          auVar118._20_4_ = 0x3f3504f3;
          auVar118._24_4_ = 0x3f3504f3;
          auVar118._28_4_ = 0x3f3504f3;
          auVar116 = vcmpps_avx(auVar11,auVar118,1);
          auVar12 = vpand_avx2(auVar116,auVar11);
          auVar88._8_8_ = 0x3f8000003f800000;
          auVar88._0_8_ = 0x3f8000003f800000;
          auVar88._16_8_ = 0x3f8000003f800000;
          auVar88._24_8_ = 0x3f8000003f800000;
          auVar11 = vsubps_avx(auVar11,auVar88);
          uStack_ba8 = auVar16._24_8_;
          auVar99._8_8_ = 0x3f8000003f800000;
          auVar99._0_8_ = 0x3f8000003f800000;
          auVar99._16_8_ = 0x3f8000003f800000;
          auVar99._24_8_ = 0x3f8000003f800000;
          auVar116 = vpand_avx2(auVar116,auVar99);
          auVar87._16_8_ = uStack_bb0;
          auVar87._0_16_ = _local_bc0;
          auVar87._24_8_ = uStack_ba8;
          auVar116 = vsubps_avx(auVar87,auVar116);
          local_aa0 = auVar11._0_4_;
          fStack_a9c = auVar11._4_4_;
          fStack_a98 = auVar11._8_4_;
          fStack_a94 = auVar11._12_4_;
          fStack_a90 = auVar11._16_4_;
          fStack_a8c = auVar11._20_4_;
          fStack_a88 = auVar11._24_4_;
          fStack_a84 = auVar11._28_4_;
          local_ac0 = auVar12._0_4_;
          fStack_abc = auVar12._4_4_;
          fStack_ab8 = auVar12._8_4_;
          fStack_ab4 = auVar12._12_4_;
          fStack_ab0 = auVar12._16_4_;
          fStack_aac = auVar12._20_4_;
          fStack_aa8 = auVar12._24_4_;
          fStack_aa4 = auVar12._28_4_;
          local_b40._0_4_ = local_ac0 + local_aa0;
          local_b40._4_4_ = fStack_abc + fStack_a9c;
          fStack_b38 = fStack_ab8 + fStack_a98;
          fStack_b34 = fStack_ab4 + fStack_a94;
          uStack_b30._0_4_ = fStack_ab0 + fStack_a90;
          uStack_b30._4_4_ = fStack_aac + fStack_a8c;
          uStack_b28._0_4_ = fStack_aa8 + fStack_a88;
          uStack_b28._4_4_ = fStack_aa4 + fStack_a84;
          fStack_c38 = 0.070376836;
          local_c40 = (undefined1  [8])0x3d9021bb3d9021bb;
          fStack_c34 = 0.070376836;
          fStack_c30 = 0.070376836;
          fStack_c2c = 0.070376836;
          fStack_c28 = 0.070376836;
          uStack_c24 = 0x3d9021bb;
          auVar98._8_4_ = -0.1151461;
          auVar98._12_4_ = -0.1151461;
          auVar98._0_4_ = -0.1151461;
          auVar98._4_4_ = -0.1151461;
          auVar98._16_4_ = -0.1151461;
          auVar98._20_4_ = -0.1151461;
          auVar98._24_4_ = -0.1151461;
          auVar98._28_4_ = -0.1151461;
          auVar13 = vfmadd213ps_fma(_local_b40,_local_c40,auVar98);
          auVar97._8_4_ = 0.116769984;
          auVar97._12_4_ = 0.116769984;
          auVar97._0_4_ = 0.116769984;
          auVar97._4_4_ = 0.116769984;
          auVar97._16_4_ = 0.116769984;
          auVar97._20_4_ = 0.116769984;
          auVar97._24_4_ = 0.116769984;
          auVar97._28_4_ = 0.116769984;
          auVar13 = vfmadd213ps_fma(_local_b40,ZEXT1632(auVar13),auVar97);
          auVar96._8_4_ = -0.12420141;
          auVar96._12_4_ = -0.12420141;
          auVar96._0_4_ = -0.12420141;
          auVar96._4_4_ = -0.12420141;
          auVar96._16_4_ = -0.12420141;
          auVar96._20_4_ = -0.12420141;
          auVar96._24_4_ = -0.12420141;
          auVar96._28_4_ = -0.12420141;
          auVar13 = vfmadd213ps_fma(_local_b40,ZEXT1632(auVar13),auVar96);
          auVar95._8_4_ = 0.14249323;
          auVar95._12_4_ = 0.14249323;
          auVar95._0_4_ = 0.14249323;
          auVar95._4_4_ = 0.14249323;
          auVar95._16_4_ = 0.14249323;
          auVar95._20_4_ = 0.14249323;
          auVar95._24_4_ = 0.14249323;
          auVar95._28_4_ = 0.14249323;
          auVar13 = vfmadd213ps_fma(_local_b40,ZEXT1632(auVar13),auVar95);
          auVar94._8_4_ = -0.16668057;
          auVar94._12_4_ = -0.16668057;
          auVar94._0_4_ = -0.16668057;
          auVar94._4_4_ = -0.16668057;
          auVar94._16_4_ = -0.16668057;
          auVar94._20_4_ = -0.16668057;
          auVar94._24_4_ = -0.16668057;
          auVar94._28_4_ = -0.16668057;
          auVar13 = vfmadd213ps_fma(_local_b40,ZEXT1632(auVar13),auVar94);
          auVar93._8_4_ = 0.20000714;
          auVar93._12_4_ = 0.20000714;
          auVar93._0_4_ = 0.20000714;
          auVar93._4_4_ = 0.20000714;
          auVar93._16_4_ = 0.20000714;
          auVar93._20_4_ = 0.20000714;
          auVar93._24_4_ = 0.20000714;
          auVar93._28_4_ = 0.20000714;
          auVar13 = vfmadd213ps_fma(_local_b40,ZEXT1632(auVar13),auVar93);
          auVar92._8_4_ = -0.24999994;
          auVar92._12_4_ = -0.24999994;
          auVar92._0_4_ = -0.24999994;
          auVar92._4_4_ = -0.24999994;
          auVar92._16_4_ = -0.24999994;
          auVar92._20_4_ = -0.24999994;
          auVar92._24_4_ = -0.24999994;
          auVar92._28_4_ = -0.24999994;
          auVar13 = vfmadd213ps_fma(_local_b40,ZEXT1632(auVar13),auVar92);
          auVar91._8_4_ = 0.3333333;
          auVar91._12_4_ = 0.3333333;
          auVar91._0_4_ = 0.3333333;
          auVar91._4_4_ = 0.3333333;
          auVar91._16_4_ = 0.3333333;
          auVar91._20_4_ = 0.3333333;
          auVar91._24_4_ = 0.3333333;
          auVar91._28_4_ = 0.3333333;
          auVar13 = vfmadd213ps_fma(_local_b40,ZEXT1632(auVar13),auVar91);
          local_9a0 = auVar13._0_4_;
          fStack_99c = auVar13._4_4_;
          fStack_998 = auVar13._8_4_;
          fStack_994 = auVar13._12_4_;
          local_c40._4_4_ =
               (float)local_b40._4_4_ * (float)local_b40._4_4_ * (float)local_b40._4_4_ * fStack_99c
          ;
          local_c40._0_4_ =
               (float)local_b40._0_4_ * (float)local_b40._0_4_ * (float)local_b40._0_4_ * local_9a0;
          fStack_c38 = fStack_b38 * fStack_b38 * fStack_b38 * fStack_998;
          fStack_c34 = fStack_b34 * fStack_b34 * fStack_b34 * fStack_994;
          fStack_c30 = (float)uStack_b30 * (float)uStack_b30 * (float)uStack_b30 * 0.0;
          fStack_c2c = uStack_b30._4_4_ * uStack_b30._4_4_ * uStack_b30._4_4_ * 0.0;
          fStack_c28 = (float)uStack_b28 * (float)uStack_b28 * (float)uStack_b28 * 0.0;
          uStack_c24 = 0;
          auVar90._8_4_ = -0.00021219444;
          auVar90._12_4_ = -0.00021219444;
          auVar90._0_4_ = -0.00021219444;
          auVar90._4_4_ = -0.00021219444;
          auVar90._16_4_ = -0.00021219444;
          auVar90._20_4_ = -0.00021219444;
          auVar90._24_4_ = -0.00021219444;
          auVar90._28_4_ = -0.00021219444;
          auVar13 = vfmadd213ps_fma(auVar90,auVar116,_local_c40);
          auVar108._4_4_ = (float)local_b40._4_4_ * (float)local_b40._4_4_;
          auVar108._0_4_ = (float)local_b40._0_4_ * (float)local_b40._0_4_;
          auVar108._8_4_ = fStack_b38 * fStack_b38;
          auVar108._12_4_ = fStack_b34 * fStack_b34;
          auVar108._16_4_ = (float)uStack_b30 * (float)uStack_b30;
          auVar108._20_4_ = uStack_b30._4_4_ * uStack_b30._4_4_;
          auVar108._24_4_ = (float)uStack_b28 * (float)uStack_b28;
          auVar108._28_4_ = uStack_b28._4_4_;
          auVar101._8_4_ = 0.5;
          auVar101._12_4_ = 0.5;
          auVar101._0_4_ = 0.5;
          auVar101._4_4_ = 0.5;
          auVar101._16_4_ = 0.5;
          auVar101._20_4_ = 0.5;
          auVar101._24_4_ = 0.5;
          auVar101._28_4_ = 0.5;
          auVar13 = vfnmadd213ps_fma(auVar101,auVar108,ZEXT1632(auVar13));
          local_b00 = auVar13._0_4_;
          fStack_afc = auVar13._4_4_;
          fStack_af8 = auVar13._8_4_;
          fStack_af4 = auVar13._12_4_;
          local_b40._4_4_ = fStack_afc + (float)local_b40._4_4_;
          local_b40._0_4_ = local_b00 + (float)local_b40._0_4_;
          fStack_b38 = fStack_af8 + fStack_b38;
          fStack_b34 = fStack_af4 + fStack_b34;
          uStack_b30._0_4_ = (float)uStack_b30 + 0.0;
          uStack_b30._4_4_ = uStack_b30._4_4_ + 0.0;
          uStack_b28._0_4_ = (float)uStack_b28 + 0.0;
          uStack_b28._4_4_ = uStack_b28._4_4_ + 0.0;
          auVar89._8_4_ = 0.6933594;
          auVar89._12_4_ = 0.6933594;
          auVar89._0_4_ = 0.6933594;
          auVar89._4_4_ = 0.6933594;
          auVar89._16_4_ = 0.6933594;
          auVar89._20_4_ = 0.6933594;
          auVar89._24_4_ = 0.6933594;
          auVar89._28_4_ = 0.6933594;
          auVar13 = vfmadd213ps_fma(auVar89,auVar116,_local_b40);
          auVar10 = vpor_avx2(auVar10,ZEXT1632(auVar13));
          auVar13 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar13 = vinsertps_avx(auVar13,ZEXT416(0x3f800000),0x20);
          auVar13 = vinsertps_avx(auVar13,ZEXT416(0x3f800000),0x30);
          auVar8 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar8 = vinsertps_avx(auVar8,ZEXT416(0x3f800000),0x20);
          auVar8 = vinsertps_avx(auVar8,ZEXT416(0x3f800000),0x30);
          uStack_15d0 = auVar8._0_8_;
          uStack_15c8 = auVar8._8_8_;
          auVar8 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
          auVar8 = vinsertps_avx(auVar8,ZEXT416(0x40000000),0x20);
          auVar8 = vinsertps_avx(auVar8,ZEXT416(0x40000000),0x30);
          auVar9 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
          auVar9 = vinsertps_avx(auVar9,ZEXT416(0x40000000),0x20);
          auVar9 = vinsertps_avx(auVar9,ZEXT416(0x40000000),0x30);
          uStack_1590 = auVar9._0_8_;
          uStack_1588 = auVar9._8_8_;
          local_1640 = auVar10._0_4_;
          fStack_163c = auVar10._4_4_;
          fStack_1638 = auVar10._8_4_;
          fStack_1634 = auVar10._12_4_;
          fStack_1630 = auVar10._16_4_;
          fStack_162c = auVar10._20_4_;
          fStack_1628 = auVar10._24_4_;
          uStack_1624 = auVar10._28_4_;
          local_1660 = auVar8._0_4_;
          fStack_165c = auVar8._4_4_;
          fStack_1658 = auVar8._8_4_;
          fStack_1654 = auVar8._12_4_;
          fStack_1650 = auVar9._0_4_;
          fStack_164c = auVar9._4_4_;
          fStack_1648 = auVar9._8_4_;
          auVar9 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar9 = vinsertps_avx(auVar9,ZEXT416(0x3f800000),0x20);
          auVar9 = vinsertps_avx(auVar9,ZEXT416(0x3f800000),0x30);
          auVar7 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar7 = vinsertps_avx(auVar7,ZEXT416(0x3f800000),0x20);
          auVar7 = vinsertps_avx(auVar7,ZEXT416(0x3f800000),0x30);
          local_1720 = auVar9._0_4_;
          fStack_171c = auVar9._4_4_;
          fStack_1718 = auVar9._8_4_;
          fStack_1714 = auVar9._12_4_;
          fStack_1710 = auVar7._0_4_;
          fStack_170c = auVar7._4_4_;
          fStack_1708 = auVar7._8_4_;
          fStack_1704 = auVar7._12_4_;
          auVar72._4_4_ = fStack_165c * fStack_163c;
          auVar72._0_4_ = local_1660 * local_1640;
          auVar72._12_4_ = fStack_1654 * fStack_1634;
          auVar72._8_4_ = fStack_1658 * fStack_1638;
          auVar72._20_4_ = fStack_164c * fStack_162c;
          auVar72._16_4_ = fStack_1650 * fStack_1630;
          auVar72._28_4_ = uStack_1624;
          auVar72._24_4_ = fStack_1648 * fStack_1628;
          auVar10 = vsubps_avx(ZEXT1632(ZEXT816(0)),auVar72);
          auVar71._8_4_ = 0x42b0c0a5;
          auVar71._0_8_ = 0x42b0c0a542b0c0a5;
          auVar71._12_4_ = 0x42b0c0a5;
          auVar71._16_4_ = 0x42b0c0a5;
          auVar71._20_4_ = 0x42b0c0a5;
          auVar71._24_4_ = 0x42b0c0a5;
          auVar71._28_4_ = 0x42b0c0a5;
          auVar10 = vminps_avx(auVar10,auVar71);
          auVar70._8_4_ = 0xc2b0c0a5;
          auVar70._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar70._12_4_ = 0xc2b0c0a5;
          auVar70._16_4_ = 0xc2b0c0a5;
          auVar70._20_4_ = 0xc2b0c0a5;
          auVar70._24_4_ = 0xc2b0c0a5;
          auVar70._28_4_ = 0xc2b0c0a5;
          auVar116 = vmaxps_avx(auVar10,auVar70);
          auVar79._8_4_ = 1.442695;
          auVar79._12_4_ = 1.442695;
          auVar79._0_4_ = 1.442695;
          auVar79._4_4_ = 1.442695;
          auVar79._16_4_ = 1.442695;
          auVar79._20_4_ = 1.442695;
          auVar79._24_4_ = 1.442695;
          auVar79._28_4_ = 1.442695;
          auVar78._8_4_ = 0.5;
          auVar78._12_4_ = 0.5;
          auVar78._0_4_ = 0.5;
          auVar78._4_4_ = 0.5;
          auVar78._16_4_ = 0.5;
          auVar78._20_4_ = 0.5;
          auVar78._24_4_ = 0.5;
          auVar78._28_4_ = 0.5;
          auVar7 = vfmadd213ps_fma(auVar79,auVar116,auVar78);
          auVar11 = vroundps_avx(ZEXT1632(auVar7),1);
          auVar10 = vcmpps_avx(ZEXT1632(auVar7),auVar11,1);
          auVar80._8_8_ = 0x3f8000003f800000;
          auVar80._0_8_ = 0x3f8000003f800000;
          auVar80._16_8_ = 0x3f8000003f800000;
          auVar80._24_8_ = 0x3f8000003f800000;
          auVar10 = vpand_avx2(auVar10,auVar80);
          auVar10 = vsubps_avx(auVar11,auVar10);
          auVar81._8_4_ = 0.6933594;
          auVar81._12_4_ = 0.6933594;
          auVar81._0_4_ = 0.6933594;
          auVar81._4_4_ = 0.6933594;
          auVar81._16_4_ = 0.6933594;
          auVar81._20_4_ = 0.6933594;
          auVar81._24_4_ = 0.6933594;
          auVar81._28_4_ = 0.6933594;
          auVar7 = vfnmadd213ps_fma(auVar81,auVar10,auVar116);
          auVar82._8_4_ = -0.00021219444;
          auVar82._12_4_ = -0.00021219444;
          auVar82._0_4_ = -0.00021219444;
          auVar82._4_4_ = -0.00021219444;
          auVar82._16_4_ = -0.00021219444;
          auVar82._20_4_ = -0.00021219444;
          auVar82._24_4_ = -0.00021219444;
          auVar82._28_4_ = -0.00021219444;
          auVar7 = vfnmadd213ps_fma(auVar82,auVar10,ZEXT1632(auVar7));
          auVar116 = ZEXT1632(auVar7);
          local_12e0 = auVar7._0_4_;
          fStack_12dc = auVar7._4_4_;
          fStack_12d8 = auVar7._8_4_;
          fStack_12d4 = auVar7._12_4_;
          _local_1460 = ZEXT1632(CONCAT412(fStack_12d4 * fStack_12d4,
                                           CONCAT48(fStack_12d8 * fStack_12d8,
                                                    CONCAT44(fStack_12dc * fStack_12dc,
                                                             local_12e0 * local_12e0))));
          local_1500._8_4_ = 0x39506967;
          local_1500._0_8_ = 0x3950696739506967;
          local_1500._12_4_ = 0x39506967;
          local_1500._16_4_ = 0x39506967;
          local_1500._20_4_ = 0x39506967;
          local_1500._24_4_ = 0x39506967;
          local_1500._28_4_ = 0x39506967;
          auVar77._8_4_ = 0.0013981999;
          auVar77._12_4_ = 0.0013981999;
          auVar77._0_4_ = 0.0013981999;
          auVar77._4_4_ = 0.0013981999;
          auVar77._16_4_ = 0.0013981999;
          auVar77._20_4_ = 0.0013981999;
          auVar77._24_4_ = 0.0013981999;
          auVar77._28_4_ = 0.0013981999;
          auVar7 = vfmadd213ps_fma(auVar116,local_1500,auVar77);
          auVar76._8_4_ = 0.008333452;
          auVar76._12_4_ = 0.008333452;
          auVar76._0_4_ = 0.008333452;
          auVar76._4_4_ = 0.008333452;
          auVar76._16_4_ = 0.008333452;
          auVar76._20_4_ = 0.008333452;
          auVar76._24_4_ = 0.008333452;
          auVar76._28_4_ = 0.008333452;
          auVar7 = vfmadd213ps_fma(auVar116,ZEXT1632(auVar7),auVar76);
          auVar75._8_4_ = 0.041665796;
          auVar75._12_4_ = 0.041665796;
          auVar75._0_4_ = 0.041665796;
          auVar75._4_4_ = 0.041665796;
          auVar75._16_4_ = 0.041665796;
          auVar75._20_4_ = 0.041665796;
          auVar75._24_4_ = 0.041665796;
          auVar75._28_4_ = 0.041665796;
          auVar7 = vfmadd213ps_fma(auVar116,ZEXT1632(auVar7),auVar75);
          auVar74._8_4_ = 0.16666666;
          auVar74._12_4_ = 0.16666666;
          auVar74._0_4_ = 0.16666666;
          auVar74._4_4_ = 0.16666666;
          auVar74._16_4_ = 0.16666666;
          auVar74._20_4_ = 0.16666666;
          auVar74._24_4_ = 0.16666666;
          auVar74._28_4_ = 0.16666666;
          auVar7 = vfmadd213ps_fma(auVar116,ZEXT1632(auVar7),auVar74);
          auVar73._8_4_ = 0.5;
          auVar73._12_4_ = 0.5;
          auVar73._0_4_ = 0.5;
          auVar73._4_4_ = 0.5;
          auVar73._16_4_ = 0.5;
          auVar73._20_4_ = 0.5;
          auVar73._24_4_ = 0.5;
          auVar73._28_4_ = 0.5;
          auVar7 = vfmadd213ps_fma(auVar116,ZEXT1632(auVar7),auVar73);
          auVar7 = vfmadd213ps_fma(_local_1460,ZEXT1632(auVar7),auVar116);
          local_13e0 = auVar7._0_4_;
          fStack_13dc = auVar7._4_4_;
          fStack_13d8 = auVar7._8_4_;
          fStack_13d4 = auVar7._12_4_;
          local_e40 = auVar10._0_4_;
          fStack_e3c = auVar10._4_4_;
          fStack_e38 = auVar10._8_4_;
          fStack_e34 = auVar10._12_4_;
          fStack_e30 = auVar10._16_4_;
          fStack_e2c = auVar10._20_4_;
          fStack_e28 = auVar10._24_4_;
          fStack_e24 = auVar10._28_4_;
          local_14a0._4_4_ = (int)fStack_e3c;
          local_14a0._0_4_ = (int)local_e40;
          local_14a0._8_4_ = (int)fStack_e38;
          local_14a0._12_4_ = (int)fStack_e34;
          uStack_1490._0_4_ = (int)fStack_e30;
          uStack_1490._4_4_ = (int)fStack_e2c;
          uStack_1488._0_4_ = (int)fStack_e28;
          uStack_1488._4_4_ = (int)fStack_e24;
          auVar10 = _local_14a0;
          uStack_1488 = auVar10._24_8_;
          auVar84._16_8_ = uStack_1490;
          auVar84._0_16_ = local_14a0;
          auVar84._24_8_ = uStack_1488;
          auVar83._8_8_ = 0x7f0000007f;
          auVar83._0_8_ = 0x7f0000007f;
          auVar83._16_8_ = 0x7f0000007f;
          auVar83._24_8_ = 0x7f0000007f;
          auVar10 = vpaddd_avx2(auVar84,auVar83);
          auVar10 = vpslld_avx2(auVar10,ZEXT416(0x17));
          local_1340 = auVar10._0_4_;
          fStack_133c = auVar10._4_4_;
          fStack_1338 = auVar10._8_4_;
          fStack_1334 = auVar10._12_4_;
          fStack_1330 = auVar10._16_4_;
          fStack_132c = auVar10._20_4_;
          fStack_1328 = auVar10._24_4_;
          auVar69._16_4_ = fStack_1710;
          auVar69._0_16_ = auVar9;
          auVar69._20_4_ = fStack_170c;
          auVar69._24_4_ = fStack_1708;
          auVar69._28_4_ = fStack_1704;
          auVar68._4_4_ = fStack_171c + (fStack_13dc + 1.0) * fStack_133c;
          auVar68._0_4_ = local_1720 + (local_13e0 + 1.0) * local_1340;
          auVar68._8_4_ = fStack_1718 + (fStack_13d8 + 1.0) * fStack_1338;
          auVar68._12_4_ = fStack_1714 + (fStack_13d4 + 1.0) * fStack_1334;
          auVar68._16_4_ = fStack_1710 + fStack_1330 * 1.0;
          auVar68._20_4_ = fStack_170c + fStack_132c * 1.0;
          auVar68._24_4_ = fStack_1708 + fStack_1328 * 1.0;
          auVar68._28_4_ = fStack_1704 + 1.0;
          auVar10 = vrcpps_avx(auVar68);
          auVar14._4_4_ = fStack_171c * auVar10._4_4_;
          auVar14._0_4_ = local_1720 * auVar10._0_4_;
          auVar14._8_4_ = fStack_1718 * auVar10._8_4_;
          auVar14._12_4_ = fStack_1714 * auVar10._12_4_;
          auVar14._16_4_ = fStack_1710 * auVar10._16_4_;
          auVar14._20_4_ = fStack_170c * auVar10._20_4_;
          auVar14._24_4_ = fStack_1708 * auVar10._24_4_;
          auVar14._28_4_ = fStack_1704;
          auVar9 = vfmsub213ps_fma(auVar14,auVar68,auVar69);
          auVar9 = vfnmadd213ps_fma(ZEXT1632(auVar9),auVar10,auVar14);
          auVar103._16_8_ = uStack_1590;
          auVar103._0_16_ = auVar8;
          auVar103._24_8_ = uStack_1588;
          auVar102._16_8_ = uStack_15d0;
          auVar102._0_16_ = auVar13;
          auVar102._24_8_ = uStack_15c8;
          auVar117._8_4_ = 0x80000000;
          auVar117._0_8_ = 0x8000000080000000;
          auVar117._12_4_ = 0x80000000;
          auVar117._16_4_ = 0x80000000;
          auVar117._20_4_ = 0x80000000;
          auVar117._24_4_ = 0x80000000;
          auVar117._28_4_ = 0x80000000;
          auVar13 = vfmadd213ps_fma(auVar103,ZEXT1632(auVar9),auVar102 ^ auVar117);
          uStack_2c04 = (undefined4)((ulong)uStack_40e8 >> 0x20);
          local_2c40 = auVar13._0_4_;
          fStack_2c3c = auVar13._4_4_;
          fStack_2c38 = auVar13._8_4_;
          fStack_2c34 = auVar13._12_4_;
          local_3200._4_4_ = fStack_2c1c * fStack_2c3c;
          local_3200._0_4_ = local_2c20 * local_2c40;
          uStack_31f8._0_4_ = fStack_2c18 * fStack_2c38;
          uStack_31f8._4_4_ = fStack_2c14 * fStack_2c34;
          uStack_31f0._0_4_ = fStack_2c10 * 0.0;
          uStack_31f0._4_4_ = fStack_2c0c * 0.0;
          uStack_31e8._0_4_ = fStack_2c08 * 0.0;
          uStack_31e8._4_4_ = uStack_2c04;
          break;
        case 6:
          uVar3 = *(uint *)*plVar15;
          auVar13 = vinsertps_avx(ZEXT416(uVar3),ZEXT416(uVar3),0x10);
          auVar13 = vinsertps_avx(auVar13,ZEXT416(uVar3),0x20);
          auVar13 = vinsertps_avx(auVar13,ZEXT416(uVar3),0x30);
          auVar8 = vinsertps_avx(ZEXT416(uVar3),ZEXT416(uVar3),0x10);
          auVar8 = vinsertps_avx(auVar8,ZEXT416(uVar3),0x20);
          auVar8 = vinsertps_avx(auVar8,ZEXT416(uVar3),0x30);
          uStack_2af0 = auVar8._0_8_;
          uStack_2ae8 = auVar8._8_8_;
          uVar3 = *(uint *)(*plVar15 + 4);
          auVar8 = vinsertps_avx(ZEXT416(uVar3),ZEXT416(uVar3),0x10);
          auVar8 = vinsertps_avx(auVar8,ZEXT416(uVar3),0x20);
          local_2da0._0_16_ = vinsertps_avx(auVar8,ZEXT416(uVar3),0x30);
          auVar8 = vinsertps_avx(ZEXT416(uVar3),ZEXT416(uVar3),0x10);
          auVar8 = vinsertps_avx(auVar8,ZEXT416(uVar3),0x20);
          auVar8 = vinsertps_avx(auVar8,ZEXT416(uVar3),0x30);
          uStack_2ab0 = auVar8._0_8_;
          uStack_2aa8 = auVar8._8_8_;
          local_2da0._16_8_ = uStack_2ab0;
          local_2da0._24_8_ = uStack_2aa8;
          auVar8 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar8 = vinsertps_avx(auVar8,ZEXT416(0x3f800000),0x20);
          auVar8 = vinsertps_avx(auVar8,ZEXT416(0x3f800000),0x30);
          auVar9 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar9 = vinsertps_avx(auVar9,ZEXT416(0x3f800000),0x20);
          auVar9 = vinsertps_avx(auVar9,ZEXT416(0x3f800000),0x30);
          uStack_2bb0 = auVar9._0_8_;
          uStack_2ba8 = auVar9._8_8_;
          auVar107._8_8_ = uStack_40f8;
          auVar107._0_8_ = local_4100;
          auVar107._16_8_ = uStack_40f0;
          auVar107._24_8_ = uStack_40e8;
          auVar106._16_8_ = uStack_2af0;
          auVar106._0_16_ = auVar13;
          auVar106._24_8_ = uStack_2ae8;
          auVar13 = vfmadd213ps_fma(auVar106,auVar107,local_2da0);
          auVar10 = vmaxps_avx(ZEXT1632(auVar13),ZEXT1632(ZEXT816(0)));
          auVar35._16_8_ = uStack_2bb0;
          auVar35._0_16_ = auVar8;
          auVar35._24_8_ = uStack_2ba8;
          auVar10 = vminps_avx(auVar10,auVar35);
          local_2c60 = auVar10._0_4_;
          fStack_2c5c = auVar10._4_4_;
          fStack_2c58 = auVar10._8_4_;
          fStack_2c54 = auVar10._12_4_;
          fStack_2c50 = auVar10._16_4_;
          fStack_2c4c = auVar10._20_4_;
          fStack_2c48 = auVar10._24_4_;
          uStack_2c44 = auVar10._28_4_;
          local_3200._4_4_ = fStack_2c5c * fStack_2c1c;
          local_3200._0_4_ = local_2c60 * local_2c20;
          uStack_31f8._0_4_ = fStack_2c58 * fStack_2c18;
          uStack_31f8._4_4_ = fStack_2c54 * fStack_2c14;
          uStack_31f0._0_4_ = fStack_2c50 * fStack_2c10;
          uStack_31f0._4_4_ = fStack_2c4c * fStack_2c0c;
          uStack_31e8._0_4_ = fStack_2c48 * fStack_2c08;
          uStack_31e8._4_4_ = uStack_2c44;
          break;
        default:
          uStack_31f8 = uStack_40f8;
          local_3200 = (undefined1  [8])local_4100;
          uStack_31f0 = uStack_40f0;
          uStack_31e8 = uStack_40e8;
        }
        *local_4068 = _local_3200;
        local_4068 = local_4068 + 1;
      }
    }
  }
  return;
}

Assistant:

static void deconvolution_pack16to8_avx512(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data_packed, const Mat& bias_data, int kernel_w, int kernel_h, int dilation_w, int dilation_h, int stride_w, int stride_h, int activation_type, const Mat& activation_params, const Option& opt)
{
    int outch = top_blob.c;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    const float* bias_data_ptr = bias_data;

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        float* outptr = top_blob.channel(p);

        const int maxk = kernel_w * kernel_h;

        // shadowed variable for less openmp task args
        const int w = bottom_blob.w;
        const int h = bottom_blob.h;
        const int channels = bottom_blob.c;
        const int outw = top_blob.w;
        const int outh = top_blob.h;

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                __m256 _sum = _mm256_setzero_ps();

                if (bias_data_ptr)
                {
                    _sum = _mm256_loadu_ps(bias_data_ptr + p * 8);
                }

                const float* kptr = weight_data_packed.channel(p);

                // channels
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob.channel(q);

                    for (int y = 0; y < kernel_h; y++)
                    {
                        int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                        if (sys < 0 || sys % stride_h != 0)
                            continue;

                        int sy = sys / stride_h;
                        if (sy >= h)
                            continue;

                        for (int x = 0; x < kernel_w; x++)
                        {
                            int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                            if (sxs < 0 || sxs % stride_w != 0)
                                continue;

                            int sx = sxs / stride_w;
                            if (sx >= w)
                                continue;

                            const float* sptr = m.row(sy) + sx * 16;

                            int k = (y * kernel_w + x) * 128;

                            __m256 _val0 = _mm256_broadcast_ss(sptr);
                            __m256 _val1 = _mm256_broadcast_ss(sptr + 1);
                            __m256 _val2 = _mm256_broadcast_ss(sptr + 2);
                            __m256 _val3 = _mm256_broadcast_ss(sptr + 3);
                            __m256 _val4 = _mm256_broadcast_ss(sptr + 4);
                            __m256 _val5 = _mm256_broadcast_ss(sptr + 5);
                            __m256 _val6 = _mm256_broadcast_ss(sptr + 6);
                            __m256 _val7 = _mm256_broadcast_ss(sptr + 7);
                            __m256 _val8 = _mm256_broadcast_ss(sptr + 8);
                            __m256 _val9 = _mm256_broadcast_ss(sptr + 9);
                            __m256 _vala = _mm256_broadcast_ss(sptr + 10);
                            __m256 _valb = _mm256_broadcast_ss(sptr + 11);
                            __m256 _valc = _mm256_broadcast_ss(sptr + 12);
                            __m256 _vald = _mm256_broadcast_ss(sptr + 13);
                            __m256 _vale = _mm256_broadcast_ss(sptr + 14);
                            __m256 _valf = _mm256_broadcast_ss(sptr + 15);
                            __m256 _w0 = _mm256_load_ps(kptr + k);
                            __m256 _w1 = _mm256_load_ps(kptr + k + 8);
                            __m256 _w2 = _mm256_load_ps(kptr + k + 8 * 2);
                            __m256 _w3 = _mm256_load_ps(kptr + k + 8 * 3);
                            __m256 _w4 = _mm256_load_ps(kptr + k + 8 * 4);
                            __m256 _w5 = _mm256_load_ps(kptr + k + 8 * 5);
                            __m256 _w6 = _mm256_load_ps(kptr + k + 8 * 6);
                            __m256 _w7 = _mm256_load_ps(kptr + k + 8 * 7);
                            __m256 _w8 = _mm256_load_ps(kptr + k + 8 * 8);
                            __m256 _w9 = _mm256_load_ps(kptr + k + 8 * 9);
                            __m256 _wa = _mm256_load_ps(kptr + k + 8 * 10);
                            __m256 _wb = _mm256_load_ps(kptr + k + 8 * 11);
                            __m256 _wc = _mm256_load_ps(kptr + k + 8 * 12);
                            __m256 _wd = _mm256_load_ps(kptr + k + 8 * 13);
                            __m256 _we = _mm256_load_ps(kptr + k + 8 * 14);
                            __m256 _wf = _mm256_load_ps(kptr + k + 8 * 15);
                            _sum = _mm256_fmadd_ps(_val0, _w0, _sum);
                            _sum = _mm256_fmadd_ps(_val1, _w1, _sum);
                            _sum = _mm256_fmadd_ps(_val2, _w2, _sum);
                            _sum = _mm256_fmadd_ps(_val3, _w3, _sum);
                            _sum = _mm256_fmadd_ps(_val4, _w4, _sum);
                            _sum = _mm256_fmadd_ps(_val5, _w5, _sum);
                            _sum = _mm256_fmadd_ps(_val6, _w6, _sum);
                            _sum = _mm256_fmadd_ps(_val7, _w7, _sum);
                            _sum = _mm256_fmadd_ps(_val8, _w8, _sum);
                            _sum = _mm256_fmadd_ps(_val9, _w9, _sum);
                            _sum = _mm256_fmadd_ps(_vala, _wa, _sum);
                            _sum = _mm256_fmadd_ps(_valb, _wb, _sum);
                            _sum = _mm256_fmadd_ps(_valc, _wc, _sum);
                            _sum = _mm256_fmadd_ps(_vald, _wd, _sum);
                            _sum = _mm256_fmadd_ps(_vale, _we, _sum);
                            _sum = _mm256_fmadd_ps(_valf, _wf, _sum);
                        }
                    }

                    kptr += maxk * 128;
                }

                _sum = activation_avx(_sum, activation_type, activation_params);

                _mm256_storeu_ps(outptr, _sum);
                outptr += 8;
            }
        }
    }
}